

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall
QTableViewPrivate::setSpan(QTableViewPrivate *this,int row,int column,int rowSpan,int columnSpan)

{
  int iVar1;
  Span *pSVar2;
  char *pcVar3;
  QSpanCollection *this_00;
  long in_FS_OFFSET;
  char local_50 [24];
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((column | row) < 0) || (rowSpan < 1)) || (columnSpan < 1)) {
    local_50[0] = '\x02';
    local_50[1] = '\0';
    local_50[2] = '\0';
    local_50[3] = '\0';
    local_50[0x14] = '\0';
    local_50[0x15] = '\0';
    local_50[0x16] = '\0';
    local_50[0x17] = '\0';
    local_50[4] = '\0';
    local_50[5] = '\0';
    local_50[6] = '\0';
    local_50[7] = '\0';
    local_50[8] = '\0';
    local_50[9] = '\0';
    local_50[10] = '\0';
    local_50[0xb] = '\0';
    local_50[0xc] = '\0';
    local_50[0xd] = '\0';
    local_50[0xe] = '\0';
    local_50[0xf] = '\0';
    local_50[0x10] = '\0';
    local_50[0x11] = '\0';
    local_50[0x12] = '\0';
    local_50[0x13] = '\0';
    local_38 = "default";
    QMessageLogger::warning
              (local_50,"QTableView::setSpan: invalid span given: (%d, %d, %d, %d)",(ulong)(uint)row
               ,(ulong)(uint)column,(ulong)(uint)rowSpan,columnSpan);
  }
  else {
    this_00 = &this->spans;
    pSVar2 = QSpanCollection::spanAt(this_00,column,row);
    if (pSVar2 == (Span *)0x0) {
      if (columnSpan != 1 || rowSpan != 1) {
        pSVar2 = (Span *)operator_new(0x14);
        pSVar2->m_top = row;
        pSVar2->m_left = column;
        pSVar2->m_bottom = row + rowSpan + -1;
        pSVar2->m_right = column + -1 + columnSpan;
        pSVar2->will_be_deleted = false;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          QSpanCollection::addSpan(this_00,pSVar2);
          return;
        }
        goto LAB_00528860;
      }
      pcVar3 = "QTableView::setSpan: single cell span won\'t be added";
    }
    else {
      if ((pSVar2->m_top == row) && (pSVar2->m_left == column)) {
        if (columnSpan == 1 && rowSpan == 1) {
          rowSpan = 0;
          columnSpan = 0;
        }
        iVar1 = pSVar2->m_bottom;
        pSVar2->m_bottom = row + rowSpan + -1;
        pSVar2->m_right = column + columnSpan + -1;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          QSpanCollection::updateSpan(this_00,pSVar2,(iVar1 - row) + 1);
          return;
        }
        goto LAB_00528860;
      }
      pcVar3 = "QTableView::setSpan: span cannot overlap";
    }
    local_38 = "default";
    local_50[0x14] = '\0';
    local_50[0x15] = '\0';
    local_50[0x16] = '\0';
    local_50[0x17] = '\0';
    local_50[0xc] = '\0';
    local_50[0xd] = '\0';
    local_50[0xe] = '\0';
    local_50[0xf] = '\0';
    local_50[0x10] = '\0';
    local_50[0x11] = '\0';
    local_50[0x12] = '\0';
    local_50[0x13] = '\0';
    local_50[4] = '\0';
    local_50[5] = '\0';
    local_50[6] = '\0';
    local_50[7] = '\0';
    local_50[8] = '\0';
    local_50[9] = '\0';
    local_50[10] = '\0';
    local_50[0xb] = '\0';
    local_50[0] = '\x02';
    local_50[1] = '\0';
    local_50[2] = '\0';
    local_50[3] = '\0';
    QMessageLogger::warning(local_50,pcVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_00528860:
  __stack_chk_fail();
}

Assistant:

void QTableViewPrivate::setSpan(int row, int column, int rowSpan, int columnSpan)
{
    if (Q_UNLIKELY(row < 0 || column < 0 || rowSpan <= 0 || columnSpan <= 0)) {
        qWarning("QTableView::setSpan: invalid span given: (%d, %d, %d, %d)",
                 row, column, rowSpan, columnSpan);
        return;
    }
    QSpanCollection::Span *sp = spans.spanAt(column, row);
    if (sp) {
        if (sp->top() != row || sp->left() != column) {
            qWarning("QTableView::setSpan: span cannot overlap");
            return;
        }
        if (rowSpan == 1 && columnSpan == 1) {
            rowSpan = columnSpan = 0;
        }
        const int old_height = sp->height();
        sp->m_bottom = row + rowSpan - 1;
        sp->m_right = column + columnSpan - 1;
        spans.updateSpan(sp, old_height);
        return;
    } else if (Q_UNLIKELY(rowSpan == 1 && columnSpan == 1)) {
        qWarning("QTableView::setSpan: single cell span won't be added");
        return;
    }
    sp = new QSpanCollection::Span(row, column, rowSpan, columnSpan);
    spans.addSpan(sp);
}